

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

void bson_iter_binary(bson_iter_t *iter,bson_subtype_t *subtype,uint32_t *binary_len,
                     uint8_t **binary)

{
  size_t *psVar1;
  long *plVar2;
  uint8_t uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  int64_t iVar8;
  _Bool _Var9;
  char cVar10;
  bson_subtype_t bVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  undefined8 uVar15;
  size_t sVar16;
  char *pcVar17;
  code *pcVar18;
  bson_oid_t *pbVar19;
  char *__s;
  ulong uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  int iVar23;
  int32_t iVar24;
  undefined4 *extraout_RDX;
  long *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var25;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar26;
  bson_json_reader_cb num_bytes;
  size_t sVar27;
  bson_error_t *__s_00;
  bson_t *pbVar28;
  uint8_t *puVar29;
  bool bVar30;
  uint32_t uVar31;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [33];
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (binary_len != (uint32_t *)0x0 || binary == (uint8_t **)0x0) {
    puVar29 = iter->raw;
    if (puVar29[iter->type] == '\x05') {
      bVar11 = (bson_subtype_t)puVar29[iter->d2];
      if (subtype == (bson_subtype_t *)0x0) {
        if (binary == (uint8_t **)0x0) {
          return;
        }
        uVar31 = *(uint32_t *)(puVar29 + iter->d1);
        *binary_len = uVar31;
        puVar29 = iter->raw + iter->d3;
        *binary = puVar29;
      }
      else {
        *subtype = (uint)puVar29[iter->d2];
        if (binary == (uint8_t **)0x0) {
          return;
        }
        uVar31 = *(uint32_t *)(puVar29 + iter->d1);
        *binary_len = uVar31;
        puVar29 = iter->raw + iter->d3;
        *binary = puVar29;
        bVar11 = *subtype;
      }
      if (bVar11 == BSON_SUBTYPE_BINARY_DEPRECATED) {
        *binary_len = uVar31 - 4;
        *binary = puVar29 + 4;
      }
    }
    else {
      if (binary != (uint8_t **)0x0) {
        *binary = (uint8_t *)0x0;
      }
      if (binary_len != (uint32_t *)0x0) {
        *binary_len = 0;
      }
      if (subtype != (bson_subtype_t *)0x0) {
        *subtype = BSON_SUBTYPE_BINARY;
      }
    }
    return;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\b') {
      return;
    }
    return;
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    uVar3 = *(uint8_t *)
             ((long)(((bson_json_reader_t *)iter)->producer).data +
             (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb);
    switch(uVar3) {
    case '\x01':
      return;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      break;
    case '\x06':
    case '\n':
      break;
    case '\b':
      return;
    default:
      if (uVar3 == '\x10') {
        return;
      }
      if (uVar3 == '\x12') {
        return;
      }
    }
    return;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return;
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\x12') {
      return;
    }
    return;
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return;
      }
      if ((bVar4 == 8) && (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return;
    }
    return;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    bVar4 = *(byte *)((long)(((bson_json_reader_t *)iter)->producer).data +
                     (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb);
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return;
      }
      if (bVar4 == 8) {
        return;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return;
    }
    return;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      plVar2 = (long *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar15 = *plVar2;
      lVar26 = plVar2[1];
      ((bson_t *)subtype)->flags = (int)uVar15;
      ((bson_t *)subtype)->len = (int)((ulong)uVar15 >> 0x20);
      *(long *)((bson_t *)subtype)->padding = lVar26;
    }
    return;
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\a') {
      return;
    }
    return;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      puVar29 = puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      puVar29 = (uint8_t *)0x0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      *(uint8_t **)subtype = puVar29;
    }
    return;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar23 = 1;
        if (1 < iVar13) {
          iVar23 = iVar13;
        }
        ((bson_t *)subtype)->flags = iVar23 - 1;
      }
      return;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = 0;
    }
    return;
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar12 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar27 = 1;
      if (1 < (int)*(uint *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar27 = (size_t)*(uint *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar31 = (int)sVar27 - 1;
      pvVar14 = bson_malloc0(sVar27);
      memcpy(pvVar14,puVar29 + uVar12,(ulong)uVar31);
      *(undefined1 *)((long)pvVar14 + (ulong)uVar31) = 0;
    }
    else {
      uVar31 = 0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar31;
    }
    return;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\r') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar23 = 1;
        if (1 < iVar13) {
          iVar23 = iVar13;
        }
        ((bson_t *)subtype)->flags = iVar23 - 1;
      }
      return;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = 0;
    }
    return;
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        ((bson_t *)subtype)->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (binary == (uint8_t **)0x0) {
        return;
      }
      *binary = (uint8_t *)0x0;
      return;
    }
    if ((bson_t *)subtype == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX =
           *(undefined4 *)
            (puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *binary = puVar29 + *(uint32_t *)
                           ((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4);
      return;
    }
    if (*(int *)(puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)subtype)->flags =
           *(int *)(puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (long *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (binary != (uint8_t **)0x0) {
      *binary = (uint8_t *)0x0;
    }
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        uVar31 = *(uint32_t *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        ((bson_t *)subtype)->flags = uVar31;
        if (uVar31 != 0) {
          ((bson_t *)subtype)->flags = uVar31 - 1;
        }
      }
      if (extraout_RDX_00 != (long *)0x0) {
        *extraout_RDX_00 =
             (long)((long)(((bson_json_reader_t *)iter)->producer).data +
                   (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
      }
      if (binary != (uint8_t **)0x0) {
        *binary = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
      }
    }
    return;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar23 = 1;
      if (1 < iVar13) {
        iVar23 = iVar13;
      }
      uVar31 = iVar23 - 1;
    }
    else {
      uVar31 = 0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar31;
    }
    return;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar31 = 0;
    uVar15 = 0;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar15 = *(undefined8 *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar31 = (uint32_t)((ulong)uVar15 >> 0x20);
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar31;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)uVar15;
    }
    return;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\t') {
      lVar26 = *(long *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(long *)subtype = lVar26 / 1000;
      *(long *)((bson_t *)subtype)->padding = (lVar26 % 1000) * 1000;
      return;
    }
    ((bson_t *)subtype)->flags = 0;
    ((bson_t *)subtype)->len = 0;
    ((bson_t *)subtype)->padding[0] = '\0';
    ((bson_t *)subtype)->padding[1] = '\0';
    ((bson_t *)subtype)->padding[2] = '\0';
    ((bson_t *)subtype)->padding[3] = '\0';
    ((bson_t *)subtype)->padding[4] = '\0';
    ((bson_t *)subtype)->padding[5] = '\0';
    ((bson_t *)subtype)->padding[6] = '\0';
    ((bson_t *)subtype)->padding[7] = '\0';
    return;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)subtype != (bson_t *)0x0) {
    _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var9) {
      do {
        puVar29 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar16 = strlen((char *)puStack_208);
          _Var9 = bson_utf8_validate((char *)puVar29,sVar16,false);
          if (!_Var9) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)subtype != (code *)0x0) &&
           (cVar10 = (**(code **)subtype)(iter,puVar29,extraout_RDX_02), cVar10 != '\0')) {
          return;
        }
        switch(uStack_210) {
        case 1:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x10);
          if (pcVar18 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar10 = (*pcVar18)(SUB84(dVar7,0),iter,puVar29,extraout_RDX_02);
          goto LAB_001118b2;
        case 2:
          pcVar17 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) {
LAB_00111968:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return;
          }
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(((bson_t *)subtype)->padding + 0x30) != (code *)0x0) {
            cVar10 = (**(code **)(((bson_t *)subtype)->padding + 0x30))
                               (iter,puVar29,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x40);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = bson_iter_oid(iter);
LAB_001118a3:
            cVar10 = (*pcVar18)(iter,puVar29,pbVar19,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x48);
          if (pcVar18 != (code *)0x0) {
            _Var9 = bson_iter_bool(iter);
            uVar12 = (uint)_Var9;
LAB_00111710:
            cVar10 = (*pcVar18)(iter,puVar29,uVar12,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x50);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x58);
LAB_0011178a:
          if (pcVar18 == (code *)0x0) break;
LAB_00111799:
          cVar10 = (*pcVar18)(iter,puVar29,extraout_RDX_02);
          goto LAB_001118b2;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar16 = strlen(__s);
          _Var9 = bson_utf8_validate(__s,sVar16,true);
          if (!_Var9) goto LAB_00111968;
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x60);
          pcVar17 = apcStack_200[0];
          if (pcVar18 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var9) goto LAB_00111968;
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x68);
          pcVar17 = apcStack_200[0];
          pbVar28 = pbStack_218;
          if (pcVar18 != (code *)0x0) {
LAB_001115a8:
            cVar10 = (*pcVar18)(iter,puVar29,uStack_220,pcVar17,pbVar28,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar17 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111968;
          pcVar18 = *(code **)(((bson_t *)subtype)->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar17 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar17,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111968;
          pcVar18 = *(code **)((long)subtype + 0x80);
LAB_001117d4:
          if (pcVar18 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_0011188b:
            cVar10 = (*pcVar18)(iter,puVar29,__s,pcVar17,extraout_RDX_02);
LAB_001118b2:
            if (cVar10 != '\0') {
              return;
            }
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar17 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(pcVar17,(ulong)uStack_220,true);
          if (!_Var9) goto LAB_00111968;
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var9) &&
             (pcVar18 = *(code **)((bson_t *)((long)subtype + 0x80))->padding,
             pcVar18 != (code *)0x0)) {
            pbVar28 = (bson_t *)apcStack_200;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar18 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 8);
          if (pcVar18 != (code *)0x0) {
            uVar12 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x10) != (code *)0x0) {
            cVar10 = (**(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x10))
                               (iter,puVar29,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar18 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x18);
          if (pcVar18 != (code *)0x0) {
            pbVar19 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar18 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x38);
LAB_0011181e:
          if (pcVar18 != (code *)0x0) {
            cVar10 = (*pcVar18)(iter,puVar29,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar18 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar18 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x28);
          }
          if (pcVar18 == (code *)0x0) break;
          puVar29 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)((bson_t *)subtype)->padding != (code *)0x0) &&
           (cVar10 = (**(code **)((bson_t *)subtype)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), cVar10 != '\0')) {
          return;
        }
        _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var9);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) &&
         (*(long *)(((bson_t *)((long)subtype + 0x80))->padding + 0x30) != 0)) {
        sVar16 = strlen((char *)puStack_208);
        _Var9 = bson_utf8_validate((char *)puStack_208,sVar16,false);
        if (_Var9) {
          (**(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x30))
                    (iter,puStack_208,uStack_210,extraout_RDX_02);
          return;
        }
      }
      if (*(code **)(((bson_t *)subtype)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)subtype)->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)subtype;
    }
    return;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)subtype;
    }
    return;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_subtype_t **)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           subtype;
    }
    return;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar29[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      lVar26 = *(long *)((bson_t *)subtype)->padding;
      plVar2 = (long *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *plVar2 = *(undefined8 *)subtype;
      plVar2[1] = lVar26;
    }
    return;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)subtype != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)subtype;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar27 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar30 = false;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar27 == 0) {
          sVar27 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar27 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          return;
        }
        if (sVar27 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar27;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar27);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar29 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar29,puVar29 + ((bson_json_reader_t *)iter)->advance,
                  sVar27 - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return;
        }
        uVar22 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar22 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar20 = uVar6 - uVar22,
           uVar22 <= uVar6 && uVar20 != 0)) {
          if (uVar20 < sVar27) {
            sVar27 = uVar20;
          }
          lVar26 = uVar22 - sVar5;
          if (lVar26 < 1) {
            lVar26 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar26,sVar27);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar30 = true;
        sVar27 = 0;
      }
      if (!bVar30) {
        return;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state == BSON_JSON_DONE) {
        return;
      }
      _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
      return;
    }
    bson_json_reader_read_cold_1();
    p_Var25 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var25 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var25 + __n + 1) {
        uVar22 = (ulong)(p_Var25 + __n) >> 1 | (ulong)(p_Var25 + __n);
        uVar22 = uVar22 >> 2 | uVar22;
        uVar22 = uVar22 >> 4 | uVar22;
        uVar22 = uVar22 >> 8 | uVar22;
        uVar22 = uVar22 >> 0x10 | uVar22;
        num_bytes = (bson_json_reader_cb)((uVar22 >> 0x20 | uVar22) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        pvVar14 = bson_realloc(pvVar14,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = pvVar14;
      }
    }
    memcpy((bson_json_destroy_cb)
           ((long)pvVar14 + (long)(((bson_json_reader_t *)iter)->producer).dcb),subtype,__n);
    p_Var25 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var25;
    p_Var25[(long)(((bson_json_reader_t *)iter)->producer).data] = (_func_void_void_ptr)0x0;
    return;
  }
  puVar29 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar12 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar4 = puVar29[uVar12];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar4
  ;
  switch(bVar4) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar17 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar19 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var9 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var9;
    break;
  case 9:
    pcVar17 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar17 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar19 = (bson_oid_t *)0x0;
    if (puVar29[uVar12] == '\f') {
      uVar12 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar13 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar29 + uVar12);
      pbVar19 = (bson_oid_t *)(puVar29 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar19,&dst->v_oid);
    break;
  case 0xd:
    if (puVar29[uVar12] == '\r') {
      iVar13 = 1;
      if (1 < *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar13 = iVar13 + -1;
      puVar21 = puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar13 = 0;
      puVar21 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
    goto LAB_00111c30;
  case 0xe:
    if (puVar29[uVar12] == '\x0e') {
      puVar21 = puVar29 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = 1;
      if (1 < *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar13 = iVar13 + -1;
    }
    else {
      puVar21 = (uint8_t *)0x0;
      iVar13 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar21;
    break;
  case 0xf:
    pcVar17 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar24 = 0;
    if (puVar29[uVar12] == '\x10') {
      iVar24 = *(int32_t *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar24;
    break;
  case 0x11:
    iVar24 = 0;
    uVar15 = 0;
    if (puVar29[uVar12] == '\x11') {
      uVar15 = *(undefined8 *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar24 = (int32_t)((ulong)uVar15 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar24;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar15;
    break;
  case 0x12:
    if (puVar29[uVar12] == '\x12') {
      pcVar17 = *(char **)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar17 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar17;
    break;
  case 0x13:
    if (puVar29[uVar12] == '\x13') {
      iVar8 = *(int64_t *)
               ((long)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar29 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8;
    }
    break;
  default:
    if ((bVar4 != BSON_TYPE_MAXKEY) && (bVar4 != 0xff)) {
      return;
    }
  }
  return;
}

Assistant:

void
bson_iter_binary (const bson_iter_t *iter, /* IN */
                  bson_subtype_t *subtype, /* OUT */
                  uint32_t *binary_len,    /* OUT */
                  const uint8_t **binary)  /* OUT */
{
   bson_subtype_t backup;

   BSON_ASSERT (iter);
   BSON_ASSERT (!binary || binary_len);

   if (ITER_TYPE (iter) == BSON_TYPE_BINARY) {
      if (!subtype) {
         subtype = &backup;
      }

      *subtype = (bson_subtype_t) * (iter->raw + iter->d2);

      if (binary) {
         memcpy (binary_len, (iter->raw + iter->d1), sizeof (*binary_len));
         *binary_len = BSON_UINT32_FROM_LE (*binary_len);
         *binary = iter->raw + iter->d3;

         if (*subtype == BSON_SUBTYPE_BINARY_DEPRECATED) {
            *binary_len -= sizeof (int32_t);
            *binary += sizeof (int32_t);
         }
      }

      return;
   }

   if (binary) {
      *binary = NULL;
   }

   if (binary_len) {
      *binary_len = 0;
   }

   if (subtype) {
      *subtype = BSON_SUBTYPE_BINARY;
   }
}